

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d1_both.cc
# Opt level: O3

bool bssl::dtls1_get_message(SSL *ssl,SSLMessage *out)

{
  undefined1 *puVar1;
  ushort uVar2;
  _Tuple_impl<0UL,_bssl::DTLSIncomingMessage_*,_bssl::internal::Deleter> _Var3;
  uint8_t *puVar4;
  uchar *puVar5;
  uint uVar6;
  bool bVar7;
  size_t in_R9;
  Span<const_unsigned_char> in;
  
  uVar2 = ssl->d1->handshake_read_seq;
  uVar6 = (uint)uVar2 * 0x2493 >> 0x10;
  _Var3.super__Head_base<0UL,_bssl::DTLSIncomingMessage_*,_false>._M_head_impl =
       ssl->d1->incoming_messages
       [(((uVar2 - uVar6 & 0xffff) >> 1) + uVar6 >> 2) * -7 + (uint)uVar2 & 0xffff]._M_t.
       super___uniq_ptr_impl<bssl::DTLSIncomingMessage,_bssl::internal::Deleter>._M_t.
       super__Tuple_impl<0UL,_bssl::DTLSIncomingMessage_*,_bssl::internal::Deleter>.
       super__Head_base<0UL,_bssl::DTLSIncomingMessage_*,_false>;
  if ((_Var3.super__Head_base<0UL,_bssl::DTLSIncomingMessage_*,_false>._M_head_impl ==
       (DTLSIncomingMessage *)0x0) ||
     (*(long *)((long)_Var3.super__Head_base<0UL,_bssl::DTLSIncomingMessage_*,_false>._M_head_impl +
               0x20) != 0)) {
    bVar7 = false;
  }
  else {
    out->type = *(uint8_t *)
                 _Var3.super__Head_base<0UL,_bssl::DTLSIncomingMessage_*,_false>._M_head_impl;
    puVar4 = *(uint8_t **)
              ((long)_Var3.super__Head_base<0UL,_bssl::DTLSIncomingMessage_*,_false>._M_head_impl +
              8);
    puVar5 = *(uchar **)
              ((long)_Var3.super__Head_base<0UL,_bssl::DTLSIncomingMessage_*,_false>._M_head_impl +
              0x10);
    (out->raw).data = puVar4;
    (out->raw).len = (size_t)puVar5;
    if (puVar5 < (uchar *)0xc) {
      abort();
    }
    (out->body).data = puVar4 + 0xc;
    (out->body).len = (size_t)(puVar5 + -0xc);
    out->is_v2_hello = false;
    bVar7 = true;
    if ((ssl->s3->field_0xdc & 8) == 0) {
      in.size_ = in_R9;
      in.data_ = puVar5;
      ssl_do_msg_callback((bssl *)ssl,(SSL *)0x0,0x16,(int)puVar4,in);
      puVar1 = &ssl->s3->field_0xdc;
      *(ushort *)puVar1 = *(ushort *)puVar1 | 8;
    }
  }
  return bVar7;
}

Assistant:

bool dtls1_get_message(const SSL *ssl, SSLMessage *out) {
  if (!dtls1_is_current_message_complete(ssl)) {
    return false;
  }

  size_t idx = ssl->d1->handshake_read_seq % SSL_MAX_HANDSHAKE_FLIGHT;
  const DTLSIncomingMessage *frag = ssl->d1->incoming_messages[idx].get();
  out->type = frag->type;
  out->raw = CBS(frag->data);
  out->body = CBS(frag->msg());
  out->is_v2_hello = false;
  if (!ssl->s3->has_message) {
    ssl_do_msg_callback(ssl, 0 /* read */, SSL3_RT_HANDSHAKE, out->raw);
    ssl->s3->has_message = true;
  }
  return true;
}